

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSetop.c
# Opt level: O0

DdNode * cuddZddUnion(DdManager *zdd,DdNode *P,DdNode *Q)

{
  DdNode *pDVar1;
  DdNode *E;
  DdManager *table;
  DdNode *res;
  DdNode *e;
  DdNode *t;
  DdNode *empty;
  int q_top;
  int p_top;
  DdNode *Q_local;
  DdNode *P_local;
  DdManager *zdd_local;
  
  if (P == zdd->zero) {
    return Q;
  }
  if (Q == zdd->zero) {
    return P;
  }
  if (P == Q) {
    return P;
  }
  pDVar1 = cuddCacheLookup2Zdd(zdd,cuddZddUnion,P,Q);
  if (pDVar1 == (DdNode *)0x0) {
    if (P->index == 0x7fffffff) {
      empty._4_4_ = P->index;
    }
    else {
      empty._4_4_ = zdd->permZ[P->index];
    }
    if (Q->index == 0x7fffffff) {
      empty._0_4_ = Q->index;
    }
    else {
      empty._0_4_ = zdd->permZ[Q->index];
    }
    if ((int)empty._4_4_ < (int)(DdHalfWord)empty) {
      pDVar1 = cuddZddUnion(zdd,(P->type).kids.E,Q);
      if (pDVar1 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
      table = (DdManager *)cuddZddGetNode(zdd,P->index,(P->type).kids.T,pDVar1);
      if (table == (DdManager *)0x0) {
        Cudd_RecursiveDerefZdd(zdd,pDVar1);
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + -1;
    }
    else if ((int)(DdHalfWord)empty < (int)empty._4_4_) {
      pDVar1 = cuddZddUnion(zdd,P,(Q->type).kids.E);
      if (pDVar1 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
      table = (DdManager *)cuddZddGetNode(zdd,Q->index,(Q->type).kids.T,pDVar1);
      if (table == (DdManager *)0x0) {
        Cudd_RecursiveDerefZdd(zdd,pDVar1);
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + -1;
    }
    else {
      pDVar1 = cuddZddUnion(zdd,(P->type).kids.T,(Q->type).kids.T);
      if (pDVar1 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
      E = cuddZddUnion(zdd,(P->type).kids.E,(Q->type).kids.E);
      if (E == (DdNode *)0x0) {
        Cudd_RecursiveDerefZdd(zdd,pDVar1);
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + 1;
      table = (DdManager *)cuddZddGetNode(zdd,P->index,pDVar1,E);
      if (table == (DdManager *)0x0) {
        Cudd_RecursiveDerefZdd(zdd,pDVar1);
        Cudd_RecursiveDerefZdd(zdd,E);
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + -1;
      *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + -1;
    }
    cuddCacheInsert2(zdd,cuddZddUnion,P,Q,&table->sentinel);
    return &table->sentinel;
  }
  return pDVar1;
}

Assistant:

DdNode *
cuddZddUnion(
  DdManager * zdd,
  DdNode * P,
  DdNode * Q)
{
    int         p_top, q_top;
    DdNode      *empty = DD_ZERO(zdd), *t, *e, *res;
    DdManager   *table = zdd;

    statLine(zdd);
    if (P == empty)
        return(Q);
    if (Q == empty)
        return(P);
    if (P == Q)
        return(P);

    /* Check cache */
    res = cuddCacheLookup2Zdd(table, cuddZddUnion, P, Q);
    if (res != NULL)
        return(res);

    if (cuddIsConstant(P))
        p_top = P->index;
    else
        p_top = zdd->permZ[P->index];
    if (cuddIsConstant(Q))
        q_top = Q->index;
    else
        q_top = zdd->permZ[Q->index];
    if (p_top < q_top) {
        e = cuddZddUnion(zdd, cuddE(P), Q);
        if (e == NULL) return (NULL);
        cuddRef(e);
        res = cuddZddGetNode(zdd, P->index, cuddT(P), e);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(table, e);
            return(NULL);
        }
        cuddDeref(e);
    } else if (p_top > q_top) {
        e = cuddZddUnion(zdd, P, cuddE(Q));
        if (e == NULL) return(NULL);
        cuddRef(e);
        res = cuddZddGetNode(zdd, Q->index, cuddT(Q), e);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(table, e);
            return(NULL);
        }
        cuddDeref(e);
    } else {
        t = cuddZddUnion(zdd, cuddT(P), cuddT(Q));
        if (t == NULL) return(NULL);
        cuddRef(t);
        e = cuddZddUnion(zdd, cuddE(P), cuddE(Q));
        if (e == NULL) {
            Cudd_RecursiveDerefZdd(table, t);
            return(NULL);
        }
        cuddRef(e);
        res = cuddZddGetNode(zdd, P->index, t, e);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(table, t);
            Cudd_RecursiveDerefZdd(table, e);
            return(NULL);
        }
        cuddDeref(t);
        cuddDeref(e);
    }

    cuddCacheInsert2(table, cuddZddUnion, P, Q, res);

    return(res);

}